

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

bool __thiscall CCoinsViewMemPool::GetCoin(CCoinsViewMemPool *this,COutPoint *outpoint,Coin *coin)

{
  CScript *pCVar1;
  CAmount *pCVar2;
  CCoinsView *pCVar3;
  undefined8 uVar4;
  int iVar5;
  const_iterator cVar6;
  ulong uVar7;
  undefined1 uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  CTransactionRef ptx;
  undefined1 local_70 [24];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_58;
  undefined4 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar6 = std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_temp_added)._M_h,outpoint);
  if (cVar6.super__Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false>._M_cur ==
      (__node_type *)0x0) {
    CTxMemPool::get((CTxMemPool *)local_70,(uint256 *)this->mempool);
    if (local_70._0_8_ == 0) {
      pCVar3 = (this->super_CCoinsViewBacked).base;
      iVar5 = (**pCVar3->_vptr_CCoinsView)(pCVar3,outpoint,coin);
      uVar8 = (undefined1)iVar5;
    }
    else {
      uVar7 = (ulong)outpoint->n;
      uVar9 = (*(long *)(local_70._0_8_ + 0x20) - *(long *)(local_70._0_8_ + 0x18) >> 3) *
              -0x3333333333333333;
      if (uVar9 < uVar7 || uVar9 - uVar7 == 0) {
        uVar8 = 0;
      }
      else {
        pCVar2 = (CAmount *)(*(long *)(local_70._0_8_ + 0x18) + uVar7 * 0x28);
        local_70._16_8_ = *pCVar2;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  (&local_58,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)(pCVar2 + 1));
        uStack_38 = 0xfffffffe;
        (coin->out).nValue = local_70._16_8_;
        pCVar1 = &(coin->out).scriptPubKey;
        if (0x1c < (coin->out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar1->super_CScriptBase)._union.indirect_contents.indirect);
        }
        *(undefined4 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             local_58._union._12_4_;
        *(undefined4 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 0x10) =
             local_58._union._16_4_;
        *(undefined4 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 0x14) =
             local_58._union._20_4_;
        *(undefined4 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 0x18) =
             local_58._union._24_4_;
        *(undefined4 *)&(pCVar1->super_CScriptBase)._union = local_58._union._0_4_;
        *(undefined4 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 4) =
             local_58._union._4_4_;
        (coin->out).scriptPubKey.super_CScriptBase._union.indirect_contents.capacity =
             local_58._union.indirect_contents.capacity;
        *(undefined4 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             local_58._union._12_4_;
        uVar4 = CONCAT44(uStack_38,local_58._size);
        local_58._size = 0;
        *(undefined8 *)&(coin->out).scriptPubKey.super_CScriptBase._size = uVar4;
        uVar8 = 1;
        std::
        _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<COutPoint_const&>
                  ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->m_non_base_coins,outpoint);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
  }
  else {
    (coin->out).nValue =
         *(CAmount *)
          ((long)cVar6.super__Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false>._M_cur +
          0x30);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(coin->out).scriptPubKey.super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)cVar6.super__Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false>.
                      _M_cur + 0x38));
    *(undefined4 *)&coin->field_0x28 =
         *(undefined4 *)
          ((long)cVar6.super__Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false>._M_cur +
          0x58);
    uVar8 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewMemPool::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    // Check to see if the inputs are made available by another tx in the package.
    // These Coins would not be available in the underlying CoinsView.
    if (auto it = m_temp_added.find(outpoint); it != m_temp_added.end()) {
        coin = it->second;
        return true;
    }

    // If an entry in the mempool exists, always return that one, as it's guaranteed to never
    // conflict with the underlying cache, and it cannot have pruned entries (as it contains full)
    // transactions. First checking the underlying cache risks returning a pruned entry instead.
    CTransactionRef ptx = mempool.get(outpoint.hash);
    if (ptx) {
        if (outpoint.n < ptx->vout.size()) {
            coin = Coin(ptx->vout[outpoint.n], MEMPOOL_HEIGHT, false);
            m_non_base_coins.emplace(outpoint);
            return true;
        } else {
            return false;
        }
    }
    return base->GetCoin(outpoint, coin);
}